

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

lego_port * __thiscall
ev3dev::lego_port::set_set_device(lego_port *__return_storage_ptr__,lego_port *this,string *v)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"set_device",&local_41);
  device::set_attr_string(&this->super_device,&local_40,v);
  std::__cxx11::string::~string((string *)&local_40);
  device::device(&__return_storage_ptr__->super_device,&this->super_device);
  return __return_storage_ptr__;
}

Assistant:

lego_port set_set_device(std::string v) {
            set_attr_string("set_device", v);
            return *this;
        }